

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void parse_version(string *full_version_string,string *version,int *extension_level)

{
  char *__s;
  int iVar1;
  char *pcVar2;
  char *local_20;
  
  QUtil::make_unique_cstr((QUtil *)&local_20,full_version_string);
  __s = local_20;
  pcVar2 = strchr(local_20,0x2e);
  if (pcVar2 != (char *)0x0) {
    pcVar2 = strchr(pcVar2 + 1,0x2e);
    if ((pcVar2 != (char *)0x0) && (pcVar2[1] != '\0')) {
      *pcVar2 = '\0';
      iVar1 = QUtil::string_to_int(pcVar2 + 1);
      *extension_level = iVar1;
    }
  }
  pcVar2 = (char *)version->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)version,0,pcVar2,(ulong)__s);
  if (local_20 != (char *)0x0) {
    operator_delete__(local_20);
  }
  return;
}

Assistant:

static void
parse_version(std::string const& full_version_string, std::string& version, int& extension_level)
{
    auto vp = QUtil::make_unique_cstr(full_version_string);
    char* v = vp.get();
    char* p1 = strchr(v, '.');
    char* p2 = (p1 ? strchr(1 + p1, '.') : nullptr);
    if (p2 && *(p2 + 1)) {
        *p2++ = '\0';
        extension_level = QUtil::string_to_int(p2);
    }
    version = v;
}